

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhsts.cpp
# Opt level: O1

bool __thiscall QHstsHeaderParser::parse(QHstsHeaderParser *this,QHttpHeaders *headers)

{
  undefined8 uVar1;
  bool bVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  long in_FS_OFFSET;
  QDateTime local_50 [8];
  undefined8 local_48;
  QArrayDataPointer<QByteArray> local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QHttpHeaders::values((QList<QByteArray> *)&local_40,headers,StrictTransportSecurity);
  iVar4 = QList<QByteArray>::begin((QList<QByteArray> *)&local_40);
  iVar5 = QList<QByteArray>::end((QList<QByteArray> *)&local_40);
  do {
    bVar2 = iVar4.i != iVar5.i;
    if (!bVar2) {
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_40);
LAB_00173512:
      this->subDomainsFound = false;
LAB_00173516:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return bVar2;
      }
      __stack_chk_fail();
    }
    QByteArray::operator=(&this->header,iVar4.i);
    bVar3 = parseSTSHeader(this);
    if ((bVar3) && (this->maxAgeFound == true)) {
      QDateTime::currentDateTimeUtc();
      QDateTime::addSecs((longlong)&local_48);
      uVar1 = *(undefined8 *)&this->expiry;
      *(undefined8 *)&this->expiry = local_48;
      local_48 = uVar1;
      QDateTime::~QDateTime((QDateTime *)&local_48);
      QDateTime::~QDateTime(local_50);
      QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_40);
      if (!bVar2) goto LAB_00173512;
      goto LAB_00173516;
    }
    iVar4.i = iVar4.i + 1;
  } while( true );
}

Assistant:

bool QHstsHeaderParser::parse(const QHttpHeaders &headers)
{
    for (const auto &value : headers.values(
                 QHttpHeaders::WellKnownHeader::StrictTransportSecurity)) {
        header = value;
        // RFC6797, 8.1:
        //
        //  The UA MUST ignore any STS header fields not conforming to the
        // grammar specified in Section 6.1 ("Strict-Transport-Security HTTP
        // Response Header Field").
        //
        // If a UA receives more than one STS header field in an HTTP
        // response message over secure transport, then the UA MUST process
        // only the first such header field.
        //
        // We read this as: ignore all invalid headers and take the first valid:
        if (parseSTSHeader() && maxAgeFound) {
            expiry = QDateTime::currentDateTimeUtc().addSecs(maxAge);
            return true;
        }
    }

    // In case it was set by a syntactically correct header (but without
    // REQUIRED max-age directive):
    subDomainsFound = false;

    return false;
}